

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

void google::protobuf::compiler::php::anon_unknown_2::GenerateFieldAccessor
               (FieldDescriptor *field,Options *options,Printer *printer)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ushort *puVar4;
  string *psVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  OneofDescriptor *pOVar9;
  Nonnull<char_*> pcVar10;
  long *plVar11;
  Descriptor *pDVar12;
  FieldDescriptor *pFVar13;
  FieldDescriptor *pFVar14;
  size_t sVar15;
  _anonymous_namespace_ *p_Var16;
  EnumDescriptor *pEVar17;
  Nonnull<const_char_*> pcVar18;
  AlphaNum *pAVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  char *pcVar21;
  undefined1 *puVar22;
  Options *pOVar23;
  int32_t value_01;
  int32_t extraout_EDX_00;
  FieldDescriptor *field_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  int32_t extraout_EDX;
  undefined8 extraout_RDX_06;
  undefined8 uVar24;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined1 uVar25;
  AlphaNum *in_R8;
  AlphaNum *c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar26;
  AlphaNum *in_R9;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view name;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  string_view text_15;
  string_view text_16;
  string_view text_17;
  string_view text_18;
  string_view text_19;
  string_view text_20;
  string_view text_21;
  string_view text_22;
  string_view text_23;
  string_view text_24;
  string_view text_25;
  string_view text_26;
  string_view text_27;
  string_view text_28;
  string_view name_00;
  string_view text_29;
  string_view text_30;
  string_view text_31;
  string_view text_32;
  string_view text_33;
  string_view text_34;
  string_view text_35;
  string_view text_36;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view value_02;
  string_view input;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view value_03;
  string_view input_00;
  string_view name_10;
  undefined1 local_260 [16];
  undefined1 auStack_250 [32];
  string result;
  undefined1 local_1f8 [48];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [40];
  string deprecation_trigger_with_conditional;
  string deprecation_trigger;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  string local_130;
  undefined1 local_110 [32];
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  long local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  int32_t value;
  int32_t value_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  
  bVar1 = field->field_0x3;
  if ((bVar1 & 1) != 0) {
    if ((field->field_0x1 & 0x10) == 0) {
      pOVar9 = (OneofDescriptor *)0x0;
    }
    else {
      pOVar9 = (field->scope_).containing_oneof;
      if (pOVar9 == (OneofDescriptor *)0x0) {
        protobuf::internal::protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb31);
      }
    }
    if (pOVar9 == (OneofDescriptor *)0x0) {
      protobuf::internal::protobuf_assumption_failed
                ("res != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb63);
    }
    if ((pOVar9->field_count_ != 1) || ((pOVar9->fields_->field_0x1 & 2) == 0)) goto LAB_001da3de;
    _GLOBAL__N_1::GenerateFieldAccessor((_GLOBAL__N_1 *)local_260);
LAB_001dbbc8:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_260,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
               ,0xb64,"!res->is_synthetic()");
    goto LAB_001dbbe5;
  }
LAB_001da3de:
  pAVar19 = (AlphaNum *)0x2;
  GenerateFieldDocComment(printer,field,options,2);
  if ((field->options_->field_0)._impl_.deprecated_ == true) {
    local_260._0_8_ = (AlphaNum *)0x10;
    local_260._8_8_ = "@trigger_error(\'";
    puVar4 = (ushort *)(field->all_names_).payload_;
    result._M_dataplus._M_p = (pointer)(ulong)*puVar4;
    result._M_string_length = (long)puVar4 + ~(ulong)result._M_dataplus._M_p;
    pAVar19 = (AlphaNum *)local_1f8;
    local_1f8._0_8_ = (pointer)0x2e;
    local_1f8._8_8_ = " is deprecated.\', E_USER_DEPRECATED);\n        ";
    absl::lts_20250127::StrCat_abi_cxx11_
              (&deprecation_trigger,(lts_20250127 *)local_260,(AlphaNum *)&result,pAVar19,in_R8);
  }
  else {
    deprecation_trigger._M_dataplus._M_p = (pointer)&deprecation_trigger.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&deprecation_trigger,"");
  }
  bVar7 = (field->options_->field_0)._impl_.deprecated_;
  if (bVar7 == true) {
    bVar2 = field->field_0x1;
    bVar6 = (bool)((bVar2 & 0x20) >> 5);
    if (0xbf < bVar2 == bVar6) {
      pcVar18 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar18 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar6,0xbf < bVar2,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar18 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_260,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar18);
      goto LAB_001dbbe5;
    }
    if ((field->field_0x1 & 0x20) == 0) {
      if ((field->field_0x3 & 1) == 0) {
        bVar6 = FieldDescriptor::has_presence(field);
        if (bVar6) {
          local_260._0_8_ = &DAT_0000000d;
          local_260._8_8_ = "isset($this->";
          puVar4 = (ushort *)(field->all_names_).payload_;
          result._M_dataplus._M_p = (pointer)(ulong)*puVar4;
          result._M_string_length = (long)puVar4 + ~(ulong)result._M_dataplus._M_p;
          local_1f8._0_8_ = (pointer)0x1;
          local_1f8._8_8_ = ")";
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_130,(lts_20250127 *)local_260,(AlphaNum *)&result,(AlphaNum *)local_1f8,
                     in_R8);
        }
        else {
          local_260._0_8_ = (AlphaNum *)0x7;
          local_260._8_8_ = "$this->";
          puVar4 = (ushort *)(field->all_names_).payload_;
          result._M_dataplus._M_p = (pointer)(ulong)*puVar4;
          result._M_string_length = (long)puVar4 + ~(ulong)result._M_dataplus._M_p;
          local_1f8._0_8_ = &DAT_00000005;
          local_1f8._8_8_ = " !== ";
          bVar6 = FieldDescriptor::has_presence(field);
          if (bVar6) {
            local_110._0_8_ = local_110 + 0x10;
            local_110._16_4_ = 0x6c6c756e;
            local_110._8_8_ = (AlphaNum *)0x4;
            local_110._20_4_ = local_110._20_4_ & 0xffffff00;
          }
          else {
            php::(anonymous_namespace)::DefaultForField_abi_cxx11_
                      ((string *)local_110,(_anonymous_namespace_ *)field,field_00);
          }
          local_1c8._0_8_ = local_110._8_8_;
          local_1c8._8_8_ = local_110._0_8_;
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_130,(lts_20250127 *)local_260,(AlphaNum *)&result,(AlphaNum *)local_1f8,
                     (AlphaNum *)local_1c8,in_R9);
          if ((AlphaNum *)local_110._0_8_ != (AlphaNum *)(local_110 + 0x10)) {
            operator_delete((void *)local_110._0_8_,CONCAT44(local_110._20_4_,local_110._16_4_) + 1)
            ;
          }
        }
      }
      else {
        if ((field->field_0x1 & 0x10) == 0) {
          pOVar9 = (OneofDescriptor *)0x0;
        }
        else {
          pOVar9 = (field->scope_).containing_oneof;
          if (pOVar9 == (OneofDescriptor *)0x0) {
            iVar8 = 0xb31;
            goto LAB_001dbcf4;
          }
        }
        if (pOVar9 == (OneofDescriptor *)0x0) {
          iVar8 = 0xb63;
LAB_001dbcf4:
          protobuf::internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,iVar8);
        }
        if ((pOVar9->field_count_ == 1) && ((pOVar9->fields_->field_0x1 & 2) != 0))
        goto LAB_001dbbc8;
        local_260._0_8_ = (AlphaNum *)0x10;
        local_260._8_8_ = "$this->hasOneof(";
        paVar20 = &result.field_2;
        pcVar10 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                            (field->number_,paVar20->_M_local_buf);
        result._M_dataplus._M_p = pcVar10 + -(long)paVar20;
        local_1f8._0_8_ = (pointer)0x1;
        local_1f8._8_8_ = ")";
        result._M_string_length = (size_type)paVar20;
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_130,(lts_20250127 *)local_260,(AlphaNum *)&result,(AlphaNum *)local_1f8,
                   in_R8);
      }
    }
    else {
      local_260._0_8_ = (AlphaNum *)0x7;
      local_260._8_8_ = (long)"isset($this->" + 6;
      puVar4 = (ushort *)(field->all_names_).payload_;
      result._M_dataplus._M_p = (pointer)(ulong)*puVar4;
      result._M_string_length = (long)puVar4 + ~(ulong)result._M_dataplus._M_p;
      local_1f8._0_8_ = (pointer)0xf;
      local_1f8._8_8_ = "->count() !== 0";
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_130,(lts_20250127 *)local_260,(AlphaNum *)&result,(AlphaNum *)local_1f8,
                 in_R8);
    }
    plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x5611f6);
    local_150 = &local_140;
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar20) {
      local_140._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_140._8_8_ = plVar11[3];
    }
    else {
      local_140._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_150 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11;
    }
    local_60 = plVar11[1];
    *plVar11 = (long)paVar20;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_58 = local_150;
    local_90.piece_._M_len = 0x10;
    local_90.piece_._M_str = ") {\n            ";
    pAVar19 = &local_c0;
    local_c0.piece_._M_len = deprecation_trigger._M_string_length;
    local_c0.piece_._M_str = deprecation_trigger._M_dataplus._M_p;
    c = &local_f0;
    local_f0.piece_._M_len = 10;
    local_f0.piece_._M_str = "}\n        ";
    absl::lts_20250127::StrCat_abi_cxx11_
              (&deprecation_trigger_with_conditional,(lts_20250127 *)&local_60,&local_90,pAVar19,c,
               in_R9);
    uVar25 = SUB81(c,0);
  }
  else {
    deprecation_trigger_with_conditional._M_dataplus._M_p =
         (pointer)&deprecation_trigger_with_conditional.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&deprecation_trigger_with_conditional,"");
    uVar25 = SUB81(in_R8,0);
  }
  if (bVar7 != false) {
    if (local_150 != &local_140) {
      operator_delete(local_150,local_140._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
  }
  if ((bVar1 & 1) == 0) {
    bVar7 = FieldDescriptor::has_presence(field);
    if ((!bVar7) || (pDVar12 = FieldDescriptor::message_type(field), pDVar12 != (Descriptor *)0x0))
    {
      puVar4 = (ushort *)(field->all_names_).payload_;
      p_Var16 = (_anonymous_namespace_ *)(ulong)*puVar4;
      name_02._M_len = (long)puVar4 + ~(ulong)p_Var16;
      name_02._M_str = (char *)pAVar19;
      php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                ((string *)local_260,p_Var16,name_02,(bool)uVar25);
      puVar4 = (ushort *)(field->all_names_).payload_;
      result._M_dataplus._M_p = (pointer)(ulong)*puVar4;
      result._M_string_length = (long)puVar4 + ~(ulong)result._M_dataplus._M_p;
      pcVar21 = "camel_name";
      pbVar26 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260;
      text_00._M_str =
           "public function get^camel_name^()\n{\n    ^deprecation_trigger^return $this->^name^;\n}\n\n"
      ;
      text_00._M_len = 0x56;
      io::Printer::
      Print<char[11],std::__cxx11::string,char[5],std::basic_string_view<char,std::char_traits<char>>,char[20],std::__cxx11::string>
                (printer,text_00,(char (*) [11])0x5ca2f1,pbVar26,(char (*) [5])0x7203be,
                 (basic_string_view<char,_std::char_traits<char>_> *)&result,
                 (char (*) [20])"deprecation_trigger",&deprecation_trigger_with_conditional);
      uVar25 = SUB81(pbVar26,0);
      goto LAB_001da98e;
    }
    puVar4 = (ushort *)(field->all_names_).payload_;
    p_Var16 = (_anonymous_namespace_ *)(ulong)*puVar4;
    name_08._M_len = (long)puVar4 + ~(ulong)p_Var16;
    name_08._M_str = (char *)pAVar19;
    php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
              ((string *)local_260,p_Var16,name_08,(bool)uVar25);
    puVar4 = (ushort *)(field->all_names_).payload_;
    local_1f8._0_8_ = ZEXT28(*puVar4);
    local_1f8._8_8_ = (long)puVar4 + ~local_1f8._0_8_;
    php::(anonymous_namespace)::DefaultForField_abi_cxx11_
              (&result,(_anonymous_namespace_ *)field,field_02);
    pcVar21 = "camel_name";
    pbVar26 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260;
    text_18._M_str =
         "public function get^camel_name^()\n{\n    ^deprecation_trigger^return isset($this->^name^) ? $this->^name^ : ^default_value^;\n}\n\n"
    ;
    text_18._M_len = 0x7f;
    io::Printer::
    Print<char[11],std::__cxx11::string,char[5],std::basic_string_view<char,std::char_traits<char>>,char[14],std::__cxx11::string,char[20],std::__cxx11::string>
              (printer,text_18,(char (*) [11])0x5ca2f1,pbVar26,(char (*) [5])0x7203be,
               (basic_string_view<char,_std::char_traits<char>_> *)local_1f8,(char (*) [14])0x6a5ca7
               ,&result,(char (*) [20])"deprecation_trigger",&deprecation_trigger_with_conditional);
    uVar25 = SUB81(pbVar26,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result._M_dataplus._M_p != &result.field_2) {
      operator_delete(result._M_dataplus._M_p,
                      CONCAT71(result.field_2._M_allocated_capacity._1_7_,
                               result.field_2._M_local_buf[0]) + 1);
    }
    if ((AlphaNum *)local_260._0_8_ != (AlphaNum *)auStack_250) goto LAB_001da99c;
  }
  else {
    puVar4 = (ushort *)(field->all_names_).payload_;
    p_Var16 = (_anonymous_namespace_ *)(ulong)*puVar4;
    name_01._M_len = (long)puVar4 + ~(ulong)p_Var16;
    name_01._M_str = (char *)pAVar19;
    php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
              ((string *)local_260,p_Var16,name_01,(bool)uVar25);
    php::(anonymous_namespace)::IntToString_abi_cxx11_
              (&result,(_anonymous_namespace_ *)(ulong)(uint)field->number_,value);
    pcVar21 = "camel_name";
    pbVar26 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260;
    text._M_str = 
    "public function get^camel_name^()\n{\n    ^deprecation_trigger^return $this->readOneof(^number^);\n}\n\n"
    ;
    text._M_len = 99;
    io::Printer::
    Print<char[11],std::__cxx11::string,char[7],std::__cxx11::string,char[20],std::__cxx11::string>
              (printer,text,(char (*) [11])0x5ca2f1,pbVar26,(char (*) [7])0x6e9ba7,&result,
               (char (*) [20])"deprecation_trigger",&deprecation_trigger_with_conditional);
    uVar25 = SUB81(pbVar26,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result._M_dataplus._M_p != &result.field_2) {
      operator_delete(result._M_dataplus._M_p,
                      CONCAT71(result.field_2._M_allocated_capacity._1_7_,
                               result.field_2._M_local_buf[0]) + 1);
    }
LAB_001da98e:
    if ((AlphaNum *)local_260._0_8_ != (AlphaNum *)auStack_250) {
LAB_001da99c:
      operator_delete((void *)local_260._0_8_,auStack_250._0_8_ + 1);
    }
  }
  if ((bVar1 & 1) == 0) {
    bVar7 = FieldDescriptor::has_presence(field);
    if (bVar7) {
      puVar4 = (ushort *)(field->all_names_).payload_;
      p_Var16 = (_anonymous_namespace_ *)(ulong)*puVar4;
      name_04._M_len = (long)puVar4 + ~(ulong)p_Var16;
      name_04._M_str = pcVar21;
      php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                ((string *)local_260,p_Var16,name_04,(bool)uVar25);
      puVar4 = (ushort *)(field->all_names_).payload_;
      local_1f8._0_8_ = ZEXT28(*puVar4);
      local_1f8._8_8_ = (long)puVar4 + ~local_1f8._0_8_;
      php::(anonymous_namespace)::DefaultForField_abi_cxx11_
                (&result,(_anonymous_namespace_ *)field,field_01);
      pbVar26 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260;
      text_02._M_str =
           "public function has^camel_name^()\n{\n    ^deprecation_trigger_with_conditional^return isset($this->^name^);\n}\n\npublic function clear^camel_name^()\n{\n    ^deprecation_trigger^unset($this->^name^);\n}\n\n"
      ;
      text_02._M_len = 0xc6;
      io::Printer::
      Print<char[11],std::__cxx11::string,char[5],std::basic_string_view<char,std::char_traits<char>>,char[14],std::__cxx11::string,char[20],std::__cxx11::string,char[37],std::__cxx11::string>
                (printer,text_02,(char (*) [11])0x5ca2f1,pbVar26,(char (*) [5])0x7203be,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_1f8,
                 (char (*) [14])0x6a5ca7,&result,(char (*) [20])"deprecation_trigger",
                 &deprecation_trigger,(char (*) [37])"deprecation_trigger_with_conditional",
                 &deprecation_trigger_with_conditional);
      uVar25 = SUB81(pbVar26,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)result._M_dataplus._M_p != &result.field_2) {
        operator_delete(result._M_dataplus._M_p,
                        CONCAT71(result.field_2._M_allocated_capacity._1_7_,
                                 result.field_2._M_local_buf[0]) + 1);
      }
      if ((AlphaNum *)local_260._0_8_ != (AlphaNum *)auStack_250) {
        operator_delete((void *)local_260._0_8_,auStack_250._0_8_ + 1);
      }
    }
  }
  else {
    puVar4 = (ushort *)(field->all_names_).payload_;
    p_Var16 = (_anonymous_namespace_ *)(ulong)*puVar4;
    name_03._M_len = (long)puVar4 + ~(ulong)p_Var16;
    name_03._M_str = pcVar21;
    php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
              ((string *)local_260,p_Var16,name_03,(bool)uVar25);
    php::(anonymous_namespace)::IntToString_abi_cxx11_
              (&result,(_anonymous_namespace_ *)(ulong)(uint)field->number_,value_00);
    pbVar26 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260;
    text_01._M_str =
         "public function has^camel_name^()\n{\n    ^deprecation_trigger^return $this->hasOneof(^number^);\n}\n\n"
    ;
    text_01._M_len = 0x62;
    io::Printer::
    Print<char[11],std::__cxx11::string,char[7],std::__cxx11::string,char[20],std::__cxx11::string>
              (printer,text_01,(char (*) [11])0x5ca2f1,pbVar26,(char (*) [7])0x6e9ba7,&result,
               (char (*) [20])"deprecation_trigger",&deprecation_trigger_with_conditional);
    uVar25 = SUB81(pbVar26,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result._M_dataplus._M_p != &result.field_2) {
      operator_delete(result._M_dataplus._M_p,
                      CONCAT71(result.field_2._M_allocated_capacity._1_7_,
                               result.field_2._M_local_buf[0]) + 1);
    }
    if ((AlphaNum *)local_260._0_8_ != (AlphaNum *)auStack_250) {
      operator_delete((void *)local_260._0_8_,auStack_250._0_8_ + 1);
    }
  }
  if ((field->type_ != '\v') || (bVar7 = FieldDescriptor::is_map_message_type(field), !bVar7)) {
    bVar2 = field->field_0x1;
    bVar7 = (bool)((bVar2 & 0x20) >> 5);
    if (0xbf < bVar2 == bVar7) {
      pcVar18 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar18 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar7,0xbf < bVar2,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar18 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_260,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar18);
      goto LAB_001dbbe5;
    }
    if (((field->field_0x1 & 0x20) == 0) &&
       (puVar22 = FieldDescriptor::kTypeToCppTypeMap,
       *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10)) {
      pDVar12 = FieldDescriptor::message_type(field);
      psVar5 = pDVar12->file_->name_;
      if ((psVar5->_M_string_length == 0x1e) &&
         (iVar8 = bcmp((psVar5->_M_dataplus)._M_p,"google/protobuf/wrappers.proto",0x1e), iVar8 == 0
         )) {
        pDVar12 = FieldDescriptor::message_type(field);
        name._M_str = "value";
        name._M_len = 5;
        pFVar13 = Descriptor::FindFieldByName(pDVar12,name);
        text_03._M_str = "/**\n";
        text_03._M_len = 4;
        io::Printer::Print<>(printer,text_03);
        puVar4 = (ushort *)(field->all_names_).payload_;
        p_Var16 = (_anonymous_namespace_ *)(ulong)*puVar4;
        name_05._M_len = (long)puVar4 + ~(ulong)p_Var16;
        name_05._M_str = puVar22;
        php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                  ((string *)local_260,p_Var16,name_05,(bool)uVar25);
        pcVar21 = "camel_name";
        text_04._M_str = " * Returns the unboxed value from <code>get^camel_name^()</code>\n\n";
        text_04._M_len = 0x42;
        io::Printer::Print<char[11],std::__cxx11::string>
                  (printer,text_04,(char (*) [11])0x5ca2f1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
        if ((AlphaNum *)local_260._0_8_ != (AlphaNum *)auStack_250) {
          operator_delete((void *)local_260._0_8_,auStack_250._0_8_ + 1);
        }
        GenerateDocCommentBody<google::protobuf::FieldDescriptor>(printer,field);
        FieldDescriptor::DebugString_abi_cxx11_((string *)local_1f8,field);
        value_02._M_str = pcVar21;
        value_02._M_len = local_1f8._0_8_;
        php::(anonymous_namespace)::FirstLineOf_abi_cxx11_
                  (&result,(_anonymous_namespace_ *)local_1f8._8_8_,value_02);
        input._M_str = pcVar21;
        input._M_len = (size_t)result._M_dataplus._M_p;
        php::(anonymous_namespace)::EscapePhpdoc_abi_cxx11_
                  ((string *)local_260,(_anonymous_namespace_ *)result._M_string_length,input);
        pOVar23 = (Options *)0x582017;
        text_05._M_str = " * Generated from protobuf field <code>^def^</code>\n";
        text_05._M_len = 0x34;
        io::Printer::Print<char[4],std::__cxx11::string>
                  (printer,text_05,(char (*) [4])0x582017,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
        if ((AlphaNum *)local_260._0_8_ != (AlphaNum *)auStack_250) {
          operator_delete((void *)local_260._0_8_,auStack_250._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)result._M_dataplus._M_p != &result.field_2) {
          operator_delete(result._M_dataplus._M_p,
                          CONCAT71(result.field_2._M_allocated_capacity._1_7_,
                                   result.field_2._M_local_buf[0]) + 1);
        }
        if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
        }
        local_260._0_8_ = local_260._0_8_ & 0xffffffffff000000;
        local_260._8_8_ =
             (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
              )0x0;
        auStack_250._0_8_ = 0;
        auStack_250._8_8_ = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
        php::(anonymous_namespace)::PhpGetterTypeName_abi_cxx11_
                  (&result,(_anonymous_namespace_ *)pFVar13,(FieldDescriptor *)local_260,pOVar23);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_260 + 8));
        pcVar21 = "php_type";
        text_06._M_str = " * @return ^php_type^|null\n";
        text_06._M_len = 0x1b;
        pbVar26 = &result;
        io::Printer::Print<char[9],std::__cxx11::string>
                  (printer,text_06,(char (*) [9])"php_type",&result);
        uVar25 = SUB81(pbVar26,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)result._M_dataplus._M_p != &result.field_2) {
          operator_delete(result._M_dataplus._M_p,
                          CONCAT71(result.field_2._M_allocated_capacity._1_7_,
                                   result.field_2._M_local_buf[0]) + 1);
        }
        text_07._M_str = " */\n";
        text_07._M_len = 4;
        io::Printer::Print<>(printer,text_07);
        puVar4 = (ushort *)(field->all_names_).payload_;
        p_Var16 = (_anonymous_namespace_ *)(ulong)*puVar4;
        name_06._M_len = (long)puVar4 + ~(ulong)p_Var16;
        name_06._M_str = pcVar21;
        php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                  ((string *)local_260,p_Var16,name_06,(bool)uVar25);
        puVar4 = (ushort *)(field->all_names_).payload_;
        result._M_dataplus._M_p = (pointer)(ulong)*puVar4;
        result._M_string_length = (long)puVar4 + ~(ulong)result._M_dataplus._M_p;
        pbVar26 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260;
        text_08._M_str =
             "public function get^camel_name^Unwrapped()\n{\n    ^deprecation_trigger^return $this->readWrapperValue(\"^field_name^\");\n}\n\n"
        ;
        text_08._M_len = 0x79;
        io::Printer::
        Print<char[11],std::__cxx11::string,char[11],std::basic_string_view<char,std::char_traits<char>>,char[20],std::__cxx11::string>
                  (printer,text_08,(char (*) [11])0x5ca2f1,pbVar26,(char (*) [11])0x5e56e8,
                   (basic_string_view<char,_std::char_traits<char>_> *)&result,
                   (char (*) [20])"deprecation_trigger",&deprecation_trigger_with_conditional);
        uVar25 = SUB81(pbVar26,0);
        if ((AlphaNum *)local_260._0_8_ != (AlphaNum *)auStack_250) {
          operator_delete((void *)local_260._0_8_,auStack_250._0_8_ + 1);
        }
      }
    }
  }
  pcVar21 = (char *)0x1;
  GenerateFieldDocComment(printer,field,options,1);
  puVar4 = (ushort *)(field->all_names_).payload_;
  p_Var16 = (_anonymous_namespace_ *)(ulong)*puVar4;
  name_07._M_len = (long)puVar4 + ~(ulong)p_Var16;
  name_07._M_str = pcVar21;
  php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
            ((string *)local_260,p_Var16,name_07,(bool)uVar25);
  pbVar26 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260;
  text_09._M_str = "public function set^camel_name^($var)\n{\n";
  text_09._M_len = 0x28;
  io::Printer::Print<char[11],std::__cxx11::string>(printer,text_09,(char (*) [11])0x5ca2f1,pbVar26)
  ;
  uVar25 = SUB81(pbVar26,0);
  if ((AlphaNum *)local_260._0_8_ != (AlphaNum *)auStack_250) {
    operator_delete((void *)local_260._0_8_,auStack_250._0_8_ + 1);
  }
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent * 2;
  if (((field->options_->field_0)._impl_.deprecated_ == true) &&
     ((field->type_ != '\v' || (bVar7 = FieldDescriptor::is_map_message_type(field), !bVar7)))) {
    bVar2 = field->field_0x1;
    bVar7 = (bool)((bVar2 & 0x20) >> 5);
    if (0xbf < bVar2 == bVar7) {
      pcVar18 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar18 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar7,0xbf < bVar2,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar18 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_260,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar18);
      goto LAB_001dbbe5;
    }
    if ((field->field_0x1 & 0x20) == 0) {
      pbVar26 = &deprecation_trigger;
      text_10._M_str = "^deprecation_trigger^";
      text_10._M_len = 0x15;
      io::Printer::Print<char[20],std::__cxx11::string>
                (printer,text_10,(char (*) [20])"deprecation_trigger",pbVar26);
      uVar25 = SUB81(pbVar26,0);
    }
  }
  if ((field->type_ == '\v') && (bVar7 = FieldDescriptor::is_map_message_type(field), bVar7)) {
    pDVar12 = FieldDescriptor::message_type(field);
    pFVar13 = Descriptor::map_key(pDVar12);
    pFVar14 = Descriptor::map_value(pDVar12);
    pcVar21 = *(char **)(FieldDescriptor::kTypeToName + (ulong)pFVar13->type_ * 8);
    sVar15 = strlen(pcVar21);
    local_260._0_8_ = auStack_250;
    local_260._8_8_ =
         (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
          )0x0;
    auStack_250._0_8_ = auStack_250._0_8_ & 0xffffffffffffff00;
    std::__cxx11::string::resize((ulong)local_260,(char)sVar15);
    absl::lts_20250127::ascii_internal::AsciiStrToUpper
              ((Nonnull<char_*>)local_260._0_8_,pcVar21,sVar15);
    pcVar21 = *(char **)(FieldDescriptor::kTypeToName + (ulong)pFVar14->type_ * 8);
    local_1b8._32_8_ = pFVar14;
    sVar15 = strlen(pcVar21);
    result._M_string_length = 0;
    result.field_2._M_local_buf[0] = '\0';
    result._M_dataplus._M_p = (pointer)&result.field_2;
    std::__cxx11::string::resize((ulong)&result,(char)sVar15);
    absl::lts_20250127::ascii_internal::AsciiStrToUpper(result._M_dataplus._M_p,pcVar21,sVar15);
    text_11._M_str =
         "$arr = GPBUtil::checkMapField($var, \\Google\\Protobuf\\Internal\\GPBType::^key_type^, \\Google\\Protobuf\\Internal\\GPBType::^value_type^"
    ;
    text_11._M_len = 0x82;
    io::Printer::Print<char[9],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,text_11,(char (*) [9])0x634516,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
               (char (*) [11])0x63460b,&result);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result._M_dataplus._M_p != &result.field_2) {
      operator_delete(result._M_dataplus._M_p,
                      CONCAT71(result.field_2._M_allocated_capacity._1_7_,
                               result.field_2._M_local_buf[0]) + 1);
    }
    if ((AlphaNum *)local_260._0_8_ != (AlphaNum *)auStack_250) {
      operator_delete((void *)local_260._0_8_,auStack_250._0_8_ + 1);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint8_t *)(local_1b8._32_8_ + 2) * 4)
        == 8) {
      pEVar17 = FieldDescriptor::enum_type((FieldDescriptor *)local_1b8._32_8_);
      FullClassName<google::protobuf::EnumDescriptor>((string *)local_1c8,pEVar17,options);
      local_260._0_8_ = local_1c8._8_8_;
      local_260._8_8_ = local_1c8._0_8_;
      result._M_dataplus._M_p = (pointer)0x7;
      result._M_string_length = (size_type)anon_var_dwarf_3facd5;
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)local_1f8,(lts_20250127 *)local_260,(AlphaNum *)&result,
                 (AlphaNum *)local_1c8._8_8_);
      text_22._M_str = ", \\^class_name^);\n";
      text_22._M_len = 0x12;
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,text_22,(char (*) [11])0x655b1b,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
      uVar24 = extraout_RDX_07;
    }
    else {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                  (ulong)*(uint8_t *)(local_1b8._32_8_ + 2) * 4) != 10) {
        text_36._M_str = ");\n";
        text_36._M_len = 3;
        io::Printer::Print<>(printer,text_36);
        uVar24 = extraout_RDX_11;
        goto LAB_001db5d8;
      }
      pDVar12 = FieldDescriptor::message_type((FieldDescriptor *)local_1b8._32_8_);
      FullClassName<google::protobuf::Descriptor>((string *)local_1c8,pDVar12,options);
      local_260._0_8_ = local_1c8._8_8_;
      local_260._8_8_ = local_1c8._0_8_;
      result._M_dataplus._M_p = (pointer)0x7;
      result._M_string_length = (size_type)anon_var_dwarf_3facd5;
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)local_1f8,(lts_20250127 *)local_260,(AlphaNum *)&result,
                 (AlphaNum *)local_1c8._8_8_);
      text_12._M_str = ", \\^class_name^);\n";
      text_12._M_len = 0x12;
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,text_12,(char (*) [11])0x655b1b,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
      uVar24 = extraout_RDX;
    }
LAB_001db596:
    if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
      uVar24 = extraout_RDX_08;
    }
    pAVar19 = (AlphaNum *)local_1c8._0_8_;
    if ((AlphaNum *)local_1c8._0_8_ != (AlphaNum *)local_1b8) {
LAB_001db5d0:
      operator_delete(pAVar19,local_1b8._0_8_ + 1);
      uVar24 = extraout_RDX_09;
    }
  }
  else {
    bVar2 = field->field_0x1;
    bVar7 = (bool)((bVar2 & 0x20) >> 5);
    if (0xbf < bVar2 == bVar7) {
      pcVar18 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar18 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar7,0xbf < bVar2,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar18 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_260,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar18);
      goto LAB_001dbbe5;
    }
    if ((field->field_0x1 & 0x20) != 0) {
      pcVar21 = *(char **)(FieldDescriptor::kTypeToName + (ulong)field->type_ * 8);
      sVar15 = strlen(pcVar21);
      local_260._0_8_ = auStack_250;
      local_260._8_8_ =
           (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
            )0x0;
      auStack_250._0_8_ = auStack_250._0_8_ & 0xffffffffffffff00;
      std::__cxx11::string::resize((ulong)local_260,(char)sVar15);
      absl::lts_20250127::ascii_internal::AsciiStrToUpper
                ((Nonnull<char_*>)local_260._0_8_,pcVar21,sVar15);
      text_14._M_str =
           "$arr = GPBUtil::checkRepeatedField($var, \\Google\\Protobuf\\Internal\\GPBType::^type^";
      text_14._M_len = 0x52;
      io::Printer::Print<char[5],std::__cxx11::string>
                (printer,text_14,(char (*) [5])0x6e6c7a,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
      if ((AlphaNum *)local_260._0_8_ != (AlphaNum *)auStack_250) {
        operator_delete((void *)local_260._0_8_,auStack_250._0_8_ + 1);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 8) {
        pEVar17 = FieldDescriptor::enum_type(field);
        FullClassName<google::protobuf::EnumDescriptor>((string *)local_1c8,pEVar17,options);
        local_260._0_8_ = local_1c8._8_8_;
        local_260._8_8_ = local_1c8._0_8_;
        result._M_dataplus._M_p = (pointer)0x7;
        result._M_string_length = (size_type)anon_var_dwarf_3facd5;
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)local_1f8,(lts_20250127 *)local_260,(AlphaNum *)&result,
                   (AlphaNum *)local_1c8._8_8_);
        text_16._M_str = ", \\^class_name^);\n";
        text_16._M_len = 0x12;
        io::Printer::Print<char[11],std::__cxx11::string>
                  (printer,text_16,(char (*) [11])0x655b1b,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
        uVar24 = extraout_RDX_02;
      }
      else {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
          text_17._M_str = ");\n";
          text_17._M_len = 3;
          io::Printer::Print<>(printer,text_17);
          uVar24 = extraout_RDX_03;
          goto LAB_001db5d8;
        }
        pDVar12 = FieldDescriptor::message_type(field);
        FullClassName<google::protobuf::Descriptor>((string *)local_1c8,pDVar12,options);
        local_260._0_8_ = local_1c8._8_8_;
        local_260._8_8_ = local_1c8._0_8_;
        result._M_dataplus._M_p = (pointer)0x7;
        result._M_string_length = (size_type)anon_var_dwarf_3facd5;
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)local_1f8,(lts_20250127 *)local_260,(AlphaNum *)&result,
                   (AlphaNum *)local_1c8._8_8_);
        text_15._M_str = ", \\^class_name^);\n";
        text_15._M_len = 0x12;
        io::Printer::Print<char[11],std::__cxx11::string>
                  (printer,text_15,(char (*) [11])0x655b1b,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
        uVar24 = extraout_RDX_01;
      }
      goto LAB_001db596;
    }
    uVar3 = *(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4);
    if ((ulong)uVar3 == 8) {
      pEVar17 = FieldDescriptor::enum_type(field);
      FullClassName<google::protobuf::EnumDescriptor>((string *)local_260,pEVar17,options);
      text_20._M_str = "GPBUtil::checkEnum($var, \\^class_name^::class);\n";
      text_20._M_len = 0x30;
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,text_20,(char (*) [11])0x655b1b,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
      uVar24 = extraout_RDX_05;
    }
    else {
      if (uVar3 == 9) {
        local_260._0_8_ = "False";
        if (field->type_ == 9) {
          local_260._0_8_ = "True";
        }
        text_19._M_str = "GPBUtil::checkString($var, ^utf8^);\n";
        text_19._M_len = 0x24;
        io::Printer::Print<char[5],char_const*>
                  (printer,text_19,(char (*) [5])0x64d78c,(char **)local_260);
        uVar24 = extraout_RDX_04;
        goto LAB_001db5d8;
      }
      if (uVar3 == 10) {
        pDVar12 = FieldDescriptor::message_type(field);
        FullClassName<google::protobuf::Descriptor>((string *)local_260,pDVar12,options);
        text_13._M_str = "GPBUtil::checkMessage($var, \\^class_name^::class);\n";
        text_13._M_len = 0x33;
        io::Printer::Print<char[11],std::__cxx11::string>
                  (printer,text_13,(char (*) [11])0x655b1b,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
        uVar24 = extraout_RDX_00;
      }
      else {
        puVar22 = FieldDescriptor::kCppTypeToName;
        pcVar21 = *(char **)(FieldDescriptor::kCppTypeToName + (ulong)uVar3 * 8);
        p_Var16 = (_anonymous_namespace_ *)strlen(pcVar21);
        name_09._M_str = puVar22;
        name_09._M_len = (size_t)pcVar21;
        php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                  ((string *)local_260,p_Var16,name_09,(bool)uVar25);
        text_21._M_str = "GPBUtil::check^type^($var);\n";
        text_21._M_len = 0x1c;
        io::Printer::Print<char[5],std::__cxx11::string>
                  (printer,text_21,(char (*) [5])0x6e6c7a,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
        uVar24 = extraout_RDX_06;
      }
    }
    local_1b8._0_8_ = auStack_250._0_8_;
    pAVar19 = (AlphaNum *)local_260._0_8_;
    if ((AlphaNum *)local_260._0_8_ != (AlphaNum *)auStack_250) goto LAB_001db5d0;
  }
LAB_001db5d8:
  value_01 = (int32_t)uVar24;
  if ((field->options_->field_0)._impl_.deprecated_ == true) {
    if ((field->type_ != '\v') ||
       (bVar7 = FieldDescriptor::is_map_message_type(field), uVar24 = extraout_RDX_10, !bVar7)) {
      bVar2 = field->field_0x1;
      value_01 = (int32_t)CONCAT71((int7)((ulong)uVar24 >> 8),0xbf < bVar2);
      bVar7 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar7) {
        pcVar18 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar18 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar7,0xbf < bVar2,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        value_01 = extraout_EDX_00;
      }
      if (pcVar18 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_260,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,pcVar18);
        goto LAB_001dbbe5;
      }
      if ((field->field_0x1 & 0x20) == 0) goto LAB_001db646;
    }
    text_23._M_str = "if ($arr->count() !== 0) {\n    ^deprecation_trigger^}\n";
    text_23._M_len = 0x36;
    io::Printer::Print<char[20],std::__cxx11::string>
              (printer,text_23,(char (*) [20])"deprecation_trigger",&deprecation_trigger);
    value_01 = extraout_EDX;
  }
LAB_001db646:
  if ((bVar1 & 1) == 0) {
    bVar1 = field->field_0x1;
    bVar7 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar7) {
      pcVar18 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar18 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar7,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar18 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_260,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar18);
      goto LAB_001dbbe5;
    }
    if ((field->field_0x1 & 0x20) == 0) {
      puVar4 = (ushort *)(field->all_names_).payload_;
      local_260._0_8_ = ZEXT28(*puVar4);
      local_260._8_8_ = ~local_260._0_8_ + (long)puVar4;
      text_25._M_str = "$this->^name^ = $var;\n";
      text_25._M_len = 0x16;
      io::Printer::Print<char[5],std::basic_string_view<char,std::char_traits<char>>>
                (printer,text_25,(char (*) [5])0x7203be,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_260);
    }
    else {
      puVar4 = (ushort *)(field->all_names_).payload_;
      local_260._0_8_ = ZEXT28(*puVar4);
      local_260._8_8_ = ~local_260._0_8_ + (long)puVar4;
      text_26._M_str = "$this->^name^ = $arr;\n";
      text_26._M_len = 0x16;
      io::Printer::Print<char[5],std::basic_string_view<char,std::char_traits<char>>>
                (printer,text_26,(char (*) [5])0x7203be,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_260);
    }
  }
  else {
    php::(anonymous_namespace)::IntToString_abi_cxx11_
              ((string *)local_260,(_anonymous_namespace_ *)(ulong)(uint)field->number_,value_01);
    text_24._M_str = "$this->writeOneof(^number^, $var);\n";
    text_24._M_len = 0x23;
    io::Printer::Print<char[7],std::__cxx11::string>
              (printer,text_24,(char (*) [7])0x6e9ba7,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
    if ((AlphaNum *)local_260._0_8_ != (AlphaNum *)auStack_250) {
      operator_delete((void *)local_260._0_8_,auStack_250._0_8_ + 1);
    }
  }
  text_27._M_str = "\nreturn $this;\n";
  text_27._M_len = 0xf;
  io::Printer::Print<>(printer,text_27);
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  text_28._M_str = "}\n\n";
  text_28._M_len = 3;
  io::Printer::Print<>(printer,text_28);
  if ((field->type_ != '\v') || (bVar7 = FieldDescriptor::is_map_message_type(field), !bVar7)) {
    bVar1 = field->field_0x1;
    bVar7 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar7) {
      pcVar18 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar18 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar7,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar18 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_260,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar18);
LAB_001dbbe5:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_260);
    }
    if (((field->field_0x1 & 0x20) == 0) &&
       (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10)) {
      pDVar12 = FieldDescriptor::message_type(field);
      psVar5 = pDVar12->file_->name_;
      if ((psVar5->_M_string_length == 0x1e) &&
         (iVar8 = bcmp((psVar5->_M_dataplus)._M_p,"google/protobuf/wrappers.proto",0x1e), iVar8 == 0
         )) {
        pDVar12 = FieldDescriptor::message_type(field);
        name_00._M_str = "value";
        name_00._M_len = 5;
        pFVar13 = Descriptor::FindFieldByName(pDVar12,name_00);
        text_29._M_str = "/**\n";
        text_29._M_len = 4;
        io::Printer::Print<>(printer,text_29);
        pDVar12 = FieldDescriptor::message_type(field);
        local_260._0_8_ = local_260._0_8_ & 0xffffffffff000000;
        local_260._8_8_ =
             (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
              )0x0;
        auStack_250._0_8_ = 0;
        auStack_250._8_8_ = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
        FullClassName<google::protobuf::Descriptor>(&result,pDVar12,(Options *)local_260);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_260 + 8));
        pcVar21 = "message_name";
        text_30._M_str =
             " * Sets the field by wrapping a primitive type in a ^message_name^ object.\n\n";
        text_30._M_len = 0x4c;
        io::Printer::Print<char[13],std::__cxx11::string>
                  (printer,text_30,(char (*) [13])"message_name",&result);
        paVar20 = &result.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)result._M_dataplus._M_p != paVar20) {
          operator_delete(result._M_dataplus._M_p,
                          CONCAT71(result.field_2._M_allocated_capacity._1_7_,
                                   result.field_2._M_local_buf[0]) + 1);
        }
        GenerateDocCommentBody<google::protobuf::FieldDescriptor>(printer,field);
        FieldDescriptor::DebugString_abi_cxx11_((string *)local_1f8,field);
        value_03._M_str = pcVar21;
        value_03._M_len = local_1f8._0_8_;
        php::(anonymous_namespace)::FirstLineOf_abi_cxx11_
                  (&result,(_anonymous_namespace_ *)local_1f8._8_8_,value_03);
        input_00._M_str = pcVar21;
        input_00._M_len = (size_t)result._M_dataplus._M_p;
        php::(anonymous_namespace)::EscapePhpdoc_abi_cxx11_
                  ((string *)local_260,(_anonymous_namespace_ *)result._M_string_length,input_00);
        pOVar23 = (Options *)0x582017;
        text_31._M_str = " * Generated from protobuf field <code>^def^</code>\n";
        text_31._M_len = 0x34;
        io::Printer::Print<char[4],std::__cxx11::string>
                  (printer,text_31,(char (*) [4])0x582017,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
        if ((undefined1 *)local_260._0_8_ != auStack_250) {
          operator_delete((void *)local_260._0_8_,auStack_250._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)result._M_dataplus._M_p != paVar20) {
          operator_delete(result._M_dataplus._M_p,
                          CONCAT71(result.field_2._M_allocated_capacity._1_7_,
                                   result.field_2._M_local_buf[0]) + 1);
        }
        if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
        }
        local_260._0_8_ = local_260._0_8_ & 0xffffffffff000000;
        local_260._8_8_ =
             (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
              )0x0;
        auStack_250._0_8_ = 0;
        auStack_250._8_8_ = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
        php::(anonymous_namespace)::PhpSetterTypeName_abi_cxx11_
                  (&result,(_anonymous_namespace_ *)pFVar13,(FieldDescriptor *)local_260,pOVar23);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_260 + 8));
        pcVar21 = "php_type";
        text_32._M_str = " * @param ^php_type^|null $var\n";
        text_32._M_len = 0x1f;
        pbVar26 = &result;
        io::Printer::Print<char[9],std::__cxx11::string>
                  (printer,text_32,(char (*) [9])"php_type",&result);
        uVar25 = SUB81(pbVar26,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)result._M_dataplus._M_p != paVar20) {
          operator_delete(result._M_dataplus._M_p,
                          CONCAT71(result.field_2._M_allocated_capacity._1_7_,
                                   result.field_2._M_local_buf[0]) + 1);
        }
        text_33._M_str = " * @return $this\n";
        text_33._M_len = 0x11;
        io::Printer::Print<>(printer,text_33);
        text_34._M_str = " */\n";
        text_34._M_len = 4;
        io::Printer::Print<>(printer,text_34);
        puVar4 = (ushort *)(field->all_names_).payload_;
        p_Var16 = (_anonymous_namespace_ *)(ulong)*puVar4;
        name_10._M_len = (long)puVar4 + ~(ulong)p_Var16;
        name_10._M_str = pcVar21;
        php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                  ((string *)local_260,p_Var16,name_10,(bool)uVar25);
        puVar4 = (ushort *)(field->all_names_).payload_;
        result._M_dataplus._M_p = (pointer)(ulong)*puVar4;
        result._M_string_length = (long)puVar4 + ~(ulong)result._M_dataplus._M_p;
        text_35._M_str =
             "public function set^camel_name^Unwrapped($var)\n{\n    $this->writeWrapperValue(\"^field_name^\", $var);\n    return $this;}\n\n"
        ;
        text_35._M_len = 0x79;
        io::Printer::
        Print<char[11],std::__cxx11::string,char[11],std::basic_string_view<char,std::char_traits<char>>>
                  (printer,text_35,(char (*) [11])0x5ca2f1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                   (char (*) [11])0x5e56e8,
                   (basic_string_view<char,_std::char_traits<char>_> *)&result);
        if ((AlphaNum *)local_260._0_8_ != (AlphaNum *)auStack_250) {
          operator_delete((void *)local_260._0_8_,auStack_250._0_8_ + 1);
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)deprecation_trigger_with_conditional._M_dataplus._M_p !=
      &deprecation_trigger_with_conditional.field_2) {
    operator_delete(deprecation_trigger_with_conditional._M_dataplus._M_p,
                    deprecation_trigger_with_conditional.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)deprecation_trigger._M_dataplus._M_p != &deprecation_trigger.field_2) {
    operator_delete(deprecation_trigger._M_dataplus._M_p,
                    deprecation_trigger.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenerateFieldAccessor(const FieldDescriptor* field, const Options& options,
                           io::Printer* printer) {
  const OneofDescriptor* oneof = field->real_containing_oneof();

  // Generate getter.
  GenerateFieldDocComment(printer, field, options, kFieldGetter);

  // deprecation
  std::string deprecation_trigger =
      (field->options().deprecated())
          ? absl::StrCat("@trigger_error('", field->name(),
                         " is deprecated.', E_USER_DEPRECATED);\n        ")
          : "";
  std::string deprecation_trigger_with_conditional =
      (field->options().deprecated())
          ? absl::StrCat("if (" + DeprecatedConditionalForField(field),
                         ") {\n            ", deprecation_trigger,
                         "}\n        ")
          : "";

  // Emit getter.
  if (oneof != nullptr) {
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    ^deprecation_trigger^return $this->readOneof(^number^);\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "number",
        IntToString(field->number()), "deprecation_trigger",
        deprecation_trigger_with_conditional);
  } else if (field->has_presence() && !field->message_type()) {
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    ^deprecation_trigger^return isset($this->^name^) ? $this->^name^ "
        ": ^default_value^;\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "name",
        field->name(), "default_value", DefaultForField(field),
        "deprecation_trigger", deprecation_trigger_with_conditional);
  } else {
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    ^deprecation_trigger^return $this->^name^;\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "name",
        field->name(), "deprecation_trigger",
        deprecation_trigger_with_conditional);
  }

  // Emit hazzers/clear.
  if (oneof) {
    printer->Print(
        "public function has^camel_name^()\n"
        "{\n"
        "    ^deprecation_trigger^return $this->hasOneof(^number^);\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "number",
        IntToString(field->number()), "deprecation_trigger",
        deprecation_trigger_with_conditional);
  } else if (field->has_presence()) {
    printer->Print(
        "public function has^camel_name^()\n"
        "{\n"
        "    ^deprecation_trigger_with_conditional^return isset($this->^name^);"
        "\n}\n\n"
        "public function clear^camel_name^()\n"
        "{\n"
        "    ^deprecation_trigger^unset($this->^name^);\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "name",
        field->name(), "default_value", DefaultForField(field),
        "deprecation_trigger", deprecation_trigger,
        "deprecation_trigger_with_conditional",
        deprecation_trigger_with_conditional);
  }

  // For wrapper types, generate an additional getXXXUnwrapped getter
  if (!field->is_map() && !field->is_repeated() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      IsWrapperType(field)) {
    GenerateWrapperFieldGetterDocComment(printer, field);
    printer->Print(
        "public function get^camel_name^Unwrapped()\n"
        "{\n"
        "    ^deprecation_trigger^return "
        "$this->readWrapperValue(\"^field_name^\");\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "field_name",
        field->name(), "deprecation_trigger",
        deprecation_trigger_with_conditional);
  }

  // Generate setter.
  GenerateFieldDocComment(printer, field, options, kFieldSetter);
  printer->Print(
      "public function set^camel_name^($var)\n"
      "{\n",
      "camel_name", UnderscoresToCamelCase(field->name(), true));

  Indent(printer);

  if (field->options().deprecated() && !field->is_map() &&
      !field->is_repeated()) {
    printer->Print("^deprecation_trigger^", "deprecation_trigger",
                   deprecation_trigger);
  }

  // Type check.
  if (field->is_map()) {
    const Descriptor* map_entry = field->message_type();
    const FieldDescriptor* key = map_entry->map_key();
    const FieldDescriptor* value = map_entry->map_value();
    printer->Print(
        "$arr = GPBUtil::checkMapField($var, "
        "\\Google\\Protobuf\\Internal\\GPBType::^key_type^, "
        "\\Google\\Protobuf\\Internal\\GPBType::^value_type^",
        "key_type", absl::AsciiStrToUpper(key->type_name()), "value_type",
        absl::AsciiStrToUpper(value->type_name()));
    if (value->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(", \\^class_name^);\n", "class_name",
                     absl::StrCat(FullClassName(value->message_type(), options),
                                  "::class"));
    } else if (value->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
          ", \\^class_name^);\n", "class_name",
          absl::StrCat(FullClassName(value->enum_type(), options), "::class"));
    } else {
      printer->Print(");\n");
    }
  } else if (field->is_repeated()) {
    printer->Print(
        "$arr = GPBUtil::checkRepeatedField($var, "
        "\\Google\\Protobuf\\Internal\\GPBType::^type^",
        "type", absl::AsciiStrToUpper(field->type_name()));
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(", \\^class_name^);\n", "class_name",
                     absl::StrCat(FullClassName(field->message_type(), options),
                                  "::class"));
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
          ", \\^class_name^);\n", "class_name",
          absl::StrCat(FullClassName(field->enum_type(), options), "::class"));
    } else {
      printer->Print(");\n");
    }
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    printer->Print("GPBUtil::checkMessage($var, \\^class_name^::class);\n",
                   "class_name", FullClassName(field->message_type(), options));
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
    printer->Print("GPBUtil::checkEnum($var, \\^class_name^::class);\n",
                   "class_name", FullClassName(field->enum_type(), options));
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    printer->Print(
        "GPBUtil::checkString($var, ^utf8^);\n", "utf8",
        field->type() == FieldDescriptor::TYPE_STRING ? "True" : "False");
  } else {
    printer->Print("GPBUtil::check^type^($var);\n", "type",
                   UnderscoresToCamelCase(field->cpp_type_name(), true));
  }

  if (field->options().deprecated() &&
      (field->is_map() || field->is_repeated())) {
    printer->Print("if ($arr->count() !== 0) {\n    ^deprecation_trigger^}\n",
                   "deprecation_trigger", deprecation_trigger);
  }

  if (oneof != nullptr) {
    printer->Print("$this->writeOneof(^number^, $var);\n", "number",
                   IntToString(field->number()));
  } else if (field->is_repeated()) {
    printer->Print("$this->^name^ = $arr;\n", "name", field->name());
  } else {
    printer->Print("$this->^name^ = $var;\n", "name", field->name());
  }

  printer->Print("\nreturn $this;\n");

  Outdent(printer);

  printer->Print("}\n\n");

  // For wrapper types, generate an additional setXXXValue getter
  if (!field->is_map() && !field->is_repeated() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      IsWrapperType(field)) {
    GenerateWrapperFieldSetterDocComment(printer, field);
    printer->Print(
        "public function set^camel_name^Unwrapped($var)\n"
        "{\n"
        "    $this->writeWrapperValue(\"^field_name^\", $var);\n"
        "    return $this;"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "field_name",
        field->name());
  }
}